

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma.hpp
# Opt level: O2

void __thiscall Statement::Statement(Statement *this)

{
  (this->super_AnalysisInterface)._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_0016d618;
  (this->m_output_statement).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d510;
  (this->m_output_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d1f8;
  (this->m_output_statement).m_expression.m_term.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d250;
  (this->m_input_statement).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d460;
  (this->m_return_statement).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d4b8;
  (this->m_return_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d1f8;
  (this->m_return_statement).m_expression.m_term.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d250;
  (this->m_assign_statement).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d568;
  (this->m_assign_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d1f8;
  (this->m_assign_statement).m_expression.m_term.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d250;
  (this->m_assign_statement).m_identifier_name._M_dataplus._M_p =
       (pointer)&(this->m_assign_statement).m_identifier_name.field_2;
  (this->m_assign_statement).m_identifier_name._M_string_length = 0;
  (this->m_assign_statement).m_identifier_name.field_2._M_local_buf[0] = '\0';
  (this->m_function_call).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d670;
  (this->m_function_call).m_value_argument_list.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d2a8;
  (this->m_function_call).m_value_argument_list.m_expression.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_0016d1f8;
  (this->m_function_call).m_value_argument_list.m_expression.m_term.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_0016d250;
  (this->m_condition_statement).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d6c8;
  (this->m_condition_statement).m_condition.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d5c0;
  (this->m_condition_statement).m_condition.m_expression.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_0016d1f8;
  (this->m_condition_statement).m_condition.m_expression.m_term.super_AnalysisInterface.
  _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_0016d250;
  (this->m_condition_statement).m_bottom_label._M_dataplus._M_p =
       (pointer)&(this->m_condition_statement).m_bottom_label.field_2;
  (this->m_condition_statement).m_bottom_label._M_string_length = 0;
  (this->m_condition_statement).m_bottom_label.field_2._M_local_buf[0] = '\0';
  WhileLoopStatement::WhileLoopStatement(&this->m_while_loop_statement);
  SwitchStatement::SwitchStatement(&this->m_switch_statement);
  return;
}

Assistant:

void LogOutput() {
        string str("This is a statement");
        g_log_tools->GrammaNormalLogs(str);
    }